

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

Move<vk::Handle<(vk::HandleType)20>_> *
vkt::api::anon_unknown_1::Sampler::create
          (Move<vk::Handle<(vk::HandleType)20>_> *__return_storage_ptr__,Environment *env,
          Resources *param_2,Parameters *params)

{
  Move<vk::Handle<(vk::HandleType)20>_> *pMVar1;
  VkSamplerCreateInfo local_50;
  
  local_50.sType = VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO;
  local_50.pNext = (void *)0x0;
  local_50.flags = 0;
  local_50._20_8_ = *(undefined8 *)param_2;
  local_50._28_8_ = *(undefined8 *)(param_2 + 8);
  local_50._36_8_ = *(undefined8 *)(param_2 + 0x10);
  local_50.mipLodBias = *(float *)(param_2 + 0x18);
  local_50.anisotropyEnable = *(VkBool32 *)(param_2 + 0x1c);
  local_50.maxAnisotropy = *(float *)(param_2 + 0x20);
  local_50._56_8_ = *(undefined8 *)(param_2 + 0x24);
  local_50._64_8_ = *(undefined8 *)(param_2 + 0x2c);
  local_50._72_8_ = *(undefined8 *)(param_2 + 0x34);
  pMVar1 = ::vk::createSampler(__return_storage_ptr__,env->vkd,env->device,&local_50,
                               env->allocationCallbacks);
  return pMVar1;
}

Assistant:

static Move<VkSampler> create (const Environment& env, const Resources&, const Parameters& params)
	{
		const VkSamplerCreateInfo	samplerInfo	=
		{
			VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO,
			DE_NULL,
			(VkSamplerCreateFlags)0,
			params.magFilter,
			params.minFilter,
			params.mipmapMode,
			params.addressModeU,
			params.addressModeV,
			params.addressModeW,
			params.mipLodBias,
			params.anisotropyEnable,
			params.maxAnisotropy,
			params.compareEnable,
			params.compareOp,
			params.minLod,
			params.maxLod,
			params.borderColor,
			params.unnormalizedCoordinates
		};

		return createSampler(env.vkd, env.device, &samplerInfo, env.allocationCallbacks);
	}